

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setCursor(QWidget *this,QCursor *cursor)

{
  bool bVar1;
  int iVar2;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool in_stack_00000013;
  WidgetAttribute in_stack_00000014;
  QWidgetPrivate *d;
  QEvent event;
  unique_ptr<QCursor,_std::default_delete<QCursor>_> *in_stack_ffffffffffffffa8;
  QWidgetPrivate *in_stack_ffffffffffffffb0;
  QEvent *this_00;
  undefined1 *local_28;
  undefined1 *puStack_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x36da6f);
  iVar2 = QCursor::shape();
  if (iVar2 == 0) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36da91);
    if (!bVar1) goto LAB_0036daf9;
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36daa5);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QCursor,_std::default_delete<QCursor>_> *)0x36dab1);
    if (!bVar1) goto LAB_0036daf9;
  }
  QWidgetPrivate::createExtra(in_stack_ffffffffffffffb0);
  std::make_unique<QCursor,QCursor_const&>((QCursor *)in_RDI);
  std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
            ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36dade);
  std::unique_ptr<QCursor,_std::default_delete<QCursor>_>::operator=
            ((unique_ptr<QCursor,_std::default_delete<QCursor>_> *)in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  std::unique_ptr<QCursor,_std::default_delete<QCursor>_>::~unique_ptr
            ((unique_ptr<QCursor,_std::default_delete<QCursor>_> *)in_stack_ffffffffffffffb0);
LAB_0036daf9:
  setAttribute((QWidget *)d,in_stack_00000014,in_stack_00000013);
  QWidgetPrivate::setCursor_sys(in_stack_ffffffffffffffb0,(QCursor *)in_stack_ffffffffffffffa8);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QEvent *)&local_28;
  QEvent::QEvent(this_00,CursorChange);
  QCoreApplication::sendEvent(in_RDI,this_00);
  QEvent::~QEvent(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidget::setCursor(const QCursor &cursor)
{
    Q_D(QWidget);
    if (cursor.shape() != Qt::ArrowCursor
        || (d->extra && d->extra->curs))
    {
        d->createExtra();
        d->extra->curs = std::make_unique<QCursor>(cursor);
    }
    setAttribute(Qt::WA_SetCursor);
    d->setCursor_sys(cursor);

    QEvent event(QEvent::CursorChange);
    QCoreApplication::sendEvent(this, &event);
}